

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O2

long __thiscall
glcts::anon_unknown_0::CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL>::Run
          (CBufferFlushMappedRange<glcts::(anonymous_namespace)::test_api::GL> *this)

{
  CallLogWrapper *this_00;
  GLboolean GVar1;
  long lVar2;
  void *__dest;
  int iVar3;
  size_t __n;
  DIResult *this_01;
  DILogger *this_02;
  uint in_R9D;
  uint widthRef;
  uint heightTest;
  uint in_stack_fffffffffffff358;
  allocator_type local_ca1;
  CallLogWrapper *local_ca0;
  uint local_c94;
  int dataHeight;
  int dataWidth;
  CDataArray dataRef;
  value_type_conflict4 local_c5c;
  CDataArray dataRef2;
  CDataArray dataTest;
  DIResult result;
  DILogger local_930;
  DILogger local_7b0;
  DILogger local_630;
  DILogger local_4b0;
  DILogger local_330;
  DILogger local_1b0;
  
  DIResult::DIResult(&result);
  this_00 = &(this->super_DrawIndirectBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenBuffers(this_00,1,&this->_buffer);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8f3f,this->_buffer);
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  DrawIndirectBase::getDataSize(&this->super_DrawIndirectBase,&dataWidth,&dataHeight);
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
             dataHeight,1,1000,in_R9D);
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_ca0 = this_00;
  DrawIndirectBase::DataGen<unsigned_int>
            ((DrawIndirectBase *)&dataRef2,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
             dataHeight,1000,2000,in_R9D);
  local_c94 = dataHeight / 2;
  widthRef = dataHeight / 4;
  glu::CallLogWrapper::glBufferData
            (local_ca0,0x8f3f,
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start,0x88e8);
  lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                    (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
  DIResult::sub_result(&local_1b0,&result,lVar2);
  iVar3 = local_c94 * dataWidth;
  DILogger::~DILogger(&local_1b0);
  lVar2 = (long)(int)(widthRef * dataWidth) * 4;
  __n = (long)iVar3 << 2;
  __dest = glu::CallLogWrapper::glMapBufferRange(local_ca0,0x8f3f,lVar2,__n,0x12);
  if (__dest == (void *)0x0) {
    DIResult::error((DILogger *)&dataTest,&result);
    glcts::(anonymous_namespace)::DILogger::operator<<
              ((DILogger *)&dataTest,
               (char (*) [74])
               "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL");
    this_02 = (DILogger *)&dataTest;
  }
  else {
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\x01',0x88b9,0x12,lVar2,__n);
    DIResult::sub_result(&local_330,&result,lVar2);
    DILogger::~DILogger(&local_330);
    memcpy(__dest,dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start + (int)(widthRef * dataWidth),__n);
    glu::CallLogWrapper::glFlushMappedBufferRange(local_ca0,0x8f3f,0,__n);
    GVar1 = glu::CallLogWrapper::glUnmapBuffer(local_ca0,0x8f3f);
    if (GVar1 == '\0') {
      this_01 = &result;
      DIResult::error((DILogger *)&dataTest,this_01);
      glcts::(anonymous_namespace)::DILogger::operator<<
                ((DILogger *)&dataTest,(char (*) [75])this_01);
      DILogger::~DILogger((DILogger *)&dataTest);
    }
    lVar2 = DrawIndirectBase::StateValidate<glcts::(anonymous_namespace)::test_api::GL>
                      (&this->super_DrawIndirectBase,'\0',0x88ba,0,0,0);
    DIResult::sub_result(&local_4b0,&result,lVar2);
    this_02 = &local_4b0;
  }
  DILogger::~DILogger(this_02);
  local_c5c = 0;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&dataTest,(long)(dataHeight * dataWidth),&local_c5c,&local_ca1);
  glu::CallLogWrapper::glGetBufferSubData
            (local_ca0,0x8f3f,0,
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start,
             dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start);
  lVar2 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     widthRef,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     widthRef,0,0,in_stack_fffffffffffff358);
  DIResult::sub_result(&local_630,&result,lVar2);
  DILogger::~DILogger(&local_630);
  lVar2 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef2,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     local_c94,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     local_c94,widthRef,widthRef,in_stack_fffffffffffff358);
  DIResult::sub_result(&local_7b0,&result,lVar2);
  DILogger::~DILogger(&local_7b0);
  heightTest = (dataHeight * 3) / 4;
  lVar2 = DrawIndirectBase::DataCompare<unsigned_int>
                    ((DrawIndirectBase *)&dataRef,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     widthRef,(uint)&dataTest,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)(ulong)(uint)dataWidth,
                     widthRef,heightTest,heightTest,in_stack_fffffffffffff358);
  DIResult::sub_result(&local_930,&result,lVar2);
  DILogger::~DILogger(&local_930);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataTest.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataRef2.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&dataRef.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  DILogger::~DILogger(&result.logger_);
  return result.status_;
}

Assistant:

virtual long Run()
	{
		DIResult result;

		glGenBuffers(1, &_buffer);
		glBindBuffer(GL_DRAW_INDIRECT_BUFFER, _buffer);

		CDataArray dataRef;
		int		   dataWidth, dataHeight;
		getDataSize(dataWidth, dataHeight);
		DataGen<unsigned int>(dataRef, dataWidth, dataHeight, 1, 1000);

		CDataArray dataRef2;
		DataGen<unsigned int>(dataRef2, dataWidth, dataHeight, 1000, 2000);

		const int halfSize	= dataHeight / 2 * dataWidth;
		const int quarterSize = dataHeight / 4 * dataWidth;

		glBufferData(GL_DRAW_INDIRECT_BUFFER, (GLsizeiptr)(dataRef.size() * sizeof(unsigned int)), &dataRef[0],
					 GL_DYNAMIC_DRAW);

		result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));

		void* buf = glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, quarterSize * sizeof(unsigned int),
									 halfSize * sizeof(unsigned int), GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT);

		if (buf == 0)
		{
			result.error() << "glMapBufferRange(GL_DRAW_INDIRECT_BUFFER, GL_MAP_WRITE_BIT) returned NULL";
		}

		if (buf)
		{
			result.sub_result(StateValidate<api>(GL_TRUE, GL_WRITE_ONLY, GL_MAP_WRITE_BIT | GL_MAP_FLUSH_EXPLICIT_BIT,
												 quarterSize * sizeof(unsigned int), halfSize * sizeof(unsigned int)));

			memcpy(buf, &dataRef2[quarterSize], halfSize * sizeof(unsigned int));
			glFlushMappedBufferRange(GL_DRAW_INDIRECT_BUFFER, 0, halfSize * sizeof(unsigned int));

			if (glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) == GL_FALSE)
			{
				result.error() << "glUnmapBuffer(GL_DRAW_INDIRECT_BUFFER) returned GL_FALSE, expected GL_TRUE";
			}
			buf = 0;

			result.sub_result(StateValidate<api>(GL_FALSE, GL_READ_WRITE, 0, 0, 0));
		}

		CDataArray dataTest(dataWidth * dataHeight, 0);
		GetBufferSubData<api>(GL_DRAW_INDIRECT_BUFFER, 0, (GLsizeiptr)(dataTest.size() * sizeof(unsigned int)),
							  &dataTest[0]);

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4));

		result.sub_result(DataCompare(dataRef2, dataWidth, dataHeight / 2, dataTest, dataWidth, dataHeight / 2,
									  dataHeight / 4, dataHeight / 4));

		result.sub_result(DataCompare(dataRef, dataWidth, dataHeight / 4, dataTest, dataWidth, dataHeight / 4,
									  dataHeight * 3 / 4, dataHeight * 3 / 4));

		return result.code();
	}